

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

Offset __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128Space
          (BinaryWriter *this,Offset leb_size_guess,char *desc)

{
  size_t sVar1;
  ulong in_RAX;
  ulong local_18;
  uint8_t data [5];
  
  local_18 = in_RAX & 0xffffff0000000000;
  sVar1 = this->stream_->offset_;
  Stream::WriteData(this->stream_,&local_18,(ulong)(this->options_->canonicalize_lebs ^ 1) * 4 + 1,
                    (char *)leb_size_guess,No);
  return sVar1;
}

Assistant:

Offset BinaryWriter::WriteU32Leb128Space(Offset leb_size_guess,
                                         const char* desc) {
  assert(leb_size_guess <= MAX_U32_LEB128_BYTES);
  uint8_t data[MAX_U32_LEB128_BYTES] = {0};
  Offset result = stream_->offset();
  Offset bytes_to_write =
      options_.canonicalize_lebs ? leb_size_guess : MAX_U32_LEB128_BYTES;
  stream_->WriteData(data, bytes_to_write, desc);
  return result;
}